

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackRemover.cpp
# Opt level: O2

void __thiscall phaeton::StackRemover::transformAssignments(StackRemover *this)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  _List_iterator<phaeton::CodeGen::Assignment> _Var5;
  ExpressionNode *pEVar6;
  IdentifierExpr *pIVar7;
  mapped_type *ppIVar8;
  _List_node_base *p_Var9;
  size_type sVar10;
  _List_node_base *p_Var11;
  ulong __val;
  uint uVar12;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  _List_node_base *local_c0;
  ExpressionNode *local_b8;
  _List_node_base **local_b0;
  string local_a8;
  ExprTreeLifter Lifter;
  
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<bool_(const_phaeton::ExpressionNode_*,_const_phaeton::ExpressionNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lijiansong[P]Phaeton/lib/Opt/StackRemover.cpp:95:35)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<bool_(const_phaeton::ExpressionNode_*,_const_phaeton::ExpressionNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lijiansong[P]Phaeton/lib/Opt/StackRemover.cpp:95:35)>
             ::_M_manager;
  ExprTreeLifter::ExprTreeLifter(&Lifter,this->CG,(LiftPredicate *)&local_e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  ExprTreeLifter::transformAssignments(&Lifter);
  p_Var11 = (_List_node_base *)this->Assignments;
  p_Var9 = p_Var11->_M_next;
  (this->CurrentPos)._M_node = p_Var9;
  do {
    if (p_Var9 == p_Var11) {
      while( true ) {
        p_Var11 = p_Var11->_M_next;
        (this->CurrentPos)._M_node = p_Var11;
        if (p_Var11 == p_Var9) {
          ExprTreeLifter::~ExprTreeLifter(&Lifter);
          return;
        }
        pEVar6 = (ExpressionNode *)p_Var11[1]._M_next;
        iVar4 = (*pEVar6->_vptr_ExpressionNode[6])(pEVar6);
        if ((char)iVar4 == '\0') break;
        (*pEVar6->_vptr_ExpressionNode[7])(&local_e8,pEVar6);
        sVar10 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_phaeton::IdentifierExpr_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_phaeton::IdentifierExpr_*>_>_>
                 ::count(&this->Replacements,(key_type *)&local_e8);
        std::__cxx11::string::~string((string *)local_e8._M_pod_data);
        if (sVar10 == 0) {
          p_Var9 = (this->CurrentPos)._M_node;
        }
        else {
          pEVar6 = buildReplacement(this,pEVar6,true);
          p_Var9 = (this->CurrentPos)._M_node;
          p_Var9[1]._M_next = (_List_node_base *)pEVar6;
        }
        p_Var9 = p_Var9[1]._M_prev;
        this->Parent = (ExpressionNode *)0x0;
        this->ChildIndex = -1;
        (*(code *)p_Var9->_M_next[2]._M_prev)(p_Var9,this);
        p_Var9 = (_List_node_base *)this->Assignments;
        p_Var11 = (this->CurrentPos)._M_node;
      }
      __assert_fail("LHS->isIdentifier()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lijiansong[P]Phaeton/lib/Opt/StackRemover.cpp"
                    ,0xa0,"void phaeton::StackRemover::transformAssignments()");
    }
    p_Var11 = p_Var9[1]._M_next;
    pEVar6 = (ExpressionNode *)p_Var9[1]._M_prev;
    cVar1 = (*(code *)((_List_node_base *)pEVar6->_vptr_ExpressionNode)[5]._M_prev)(pEVar6);
    _Var5._M_node = (this->CurrentPos)._M_node;
    if (cVar1 == '\0') {
      p_Var9 = (_Var5._M_node)->_M_next;
      (this->CurrentPos)._M_node = p_Var9;
    }
    else {
      _Var5 = std::next<std::_List_iterator<phaeton::CodeGen::Assignment>>(_Var5,1);
      (*(code *)p_Var11->_M_next[3]._M_prev)(&local_e8);
      local_b0 = &p_Var11[2]._M_prev;
      local_c0 = p_Var11 + 8;
      local_b8 = pEVar6;
      for (__val = 0; __val < (uint)local_b8->NumChildren; __val = __val + 1) {
        pEVar6 = ExpressionNode::getChild(local_b8,(int)__val);
        pIVar7 = ExpressionNodeBuilder::createIdentifierExpr
                           (this->ExprNodeBuilder,(string *)&local_e8,(ExprDims *)local_b0);
        uVar12 = 0;
        while( true ) {
          uVar3 = (*(code *)p_Var11->_M_next[4]._M_prev)(p_Var11);
          if (uVar3 <= uVar12) break;
          (*(code *)p_Var11->_M_next[4]._M_next)(&local_a8,p_Var11,uVar12);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&pIVar7->Indices,&local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
          uVar12 = uVar12 + 1;
        }
        std::__cxx11::to_string(&local_a8,__val);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pIVar7->Indices,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        if (*(char *)&p_Var11[7]._M_prev == '\x01') {
          pIVar7->Permute = true;
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator=(&pIVar7->IndexPairs,
                      (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       *)local_c0);
        }
        iVar4 = (*pEVar6->_vptr_ExpressionNode[6])(pEVar6);
        if ((char)iVar4 == '\0') {
LAB_00132b59:
          local_a8._M_dataplus._M_p = (pointer)pIVar7;
          local_a8._M_string_length = (size_type)pEVar6;
          std::__cxx11::
          list<phaeton::CodeGen::Assignment,_std::allocator<phaeton::CodeGen::Assignment>_>::
          emplace<phaeton::CodeGen::Assignment>
                    (this->Assignments,(const_iterator)_Var5._M_node,(Assignment *)&local_a8);
        }
        else {
          bVar2 = isDeclaredId(this,pEVar6);
          if (bVar2) goto LAB_00132b59;
          (*pEVar6->_vptr_ExpressionNode[7])(&local_a8,pEVar6);
          ppIVar8 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_phaeton::IdentifierExpr_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_phaeton::IdentifierExpr_*>_>_>
                    ::operator[](&this->Replacements,&local_a8);
          *ppIVar8 = pIVar7;
          std::__cxx11::string::~string((string *)&local_a8);
        }
      }
      std::__cxx11::
      list<phaeton::CodeGen::Assignment,_std::allocator<phaeton::CodeGen::Assignment>_>::erase
                (this->Assignments,(this->CurrentPos)._M_node);
      (this->CurrentPos)._M_node = _Var5._M_node;
      std::__cxx11::string::~string((string *)local_e8._M_pod_data);
      p_Var9 = (this->CurrentPos)._M_node;
    }
    p_Var11 = (_List_node_base *)this->Assignments;
  } while( true );
}

Assistant:

void StackRemover::transformAssignments() {
  // 1. We need to lift all tensor stack expressions up to the top level.
  const auto &nodeLiftPredicate = [](const ExpressionNode *Node,
                                     const ExpressionNode *Root) {
    return Node->isStackExpr();
  };
  ExprTreeLifter Lifter(CG, nodeLiftPredicate);
  Lifter.transformAssignments();

  // 2. We need to find all stack expressions and remove them.
  CurrentPos = Assignments.begin();
  while (CurrentPos != Assignments.end()) {
    IdentifierExpr *LHS = static_cast<IdentifierExpr *>(CurrentPos->LHS);
    ExpressionNode *RHS = CurrentPos->RHS;

    if (!RHS->isStackExpr()) {
      ++CurrentPos;
      continue;
    }

    const auto NextPos = std::next(CurrentPos);
    const std::string &LHSName = LHS->getName();

    for (unsigned I = 0; I < RHS->getNumChildren(); ++I) {
      ExpressionNode *Child = RHS->getChild(I);

      // Note here we build 'LHS' for assigning the i-th child.
      IdentifierExpr *Id =
          ExprNodeBuilder->createIdentifierExpr(LHSName, LHS->getDims());
      for (unsigned J = 0; J < LHS->getNumIndices(); ++J) {
        Id->addIndex(LHS->getIndex(J));
      }
      Id->addIndex(std::to_string((long long)I));
      if (LHS->getPermute()) {
        Id->setPermute(true);
        Id->setIndexPairs(LHS->getIndexPairs());
      }

      if (Child->isIdentifier() && !isDeclaredId(Child)) {
        // The 'Child' node is an Identifier that has not been declared
        // explicitly in Phaeton program. Hence, this Identifier must have
        // been inserted by a transformation, here the transformation is
        // performed by lifting stack expressions to the top level. Therefore,
        // the Identifier only has a single use, i.e. inside the current stack
        // expression. Since the identifier has been inserted by a
        // transformation, it also has only one single definition.
        Replacements[Child->getName()] = Id;
      } else {
        // The assignemnt of the 'Child' node is inserted before next
        // assignment in Phaeton program. Since stacks have been lifted to the
        // top level, the expression tree rooted at 'Child' node does not
        // contain any stack expressions. Hence, current transformation
        // need not be applied recursively to the new assignment.
        Assignments.insert(NextPos, {Id, Child});
      }
    }

    Assignments.erase(CurrentPos);
    CurrentPos = NextPos;
  }

  // 3. Now we need to apply the replacements.
  for (CurrentPos = Assignments.begin(); CurrentPos != Assignments.end();
       ++CurrentPos) {
    // Here we handle replacements of defs, i.e. replacements on 'LHS'.
    {
      ExpressionNode *LHS = CurrentPos->LHS;
      assert(LHS->isIdentifier());
      if (Replacements.count(LHS->getName()))
        CurrentPos->LHS = buildReplacement(LHS, /* IsForLHS = */ true);
    }

    // Here we handle replacements of uses, i.e. replacements on 'RHS'.
    {
      ExpressionNode *RHS = CurrentPos->RHS;
      setParent(nullptr);
      setChildIndex(-1);
      RHS->transform(this);
    }
  }
}